

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

double * __thiscall
google::protobuf::RepeatedField<double>::elements(RepeatedField<double> *this,bool is_soo)

{
  Nullable<const_char_*> failure_msg;
  double *pdVar1;
  undefined7 in_register_00000031;
  int v1;
  LogMessageFatal local_20;
  
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    v1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  else {
    v1 = 1;
  }
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl(v1,0,"Capacity(is_soo) > 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (is_soo) {
      return (double *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pdVar1 = (double *)internal::LongSooRep::elements((LongSooRep *)this);
    return pdVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x247,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }